

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::XmlUnitTestResultPrinter::OnTestIterationEnd
          (XmlUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  undefined8 __stream;
  undefined8 uVar1;
  ostream *local_1e8;
  string local_1e0;
  undefined1 local_1b0 [8];
  stringstream stream;
  FILE *xmlout;
  int param_2_local;
  UnitTest *unit_test_local;
  XmlUnitTestResultPrinter *this_local;
  
  stream._384_8_ = OpenFileForWriting(&this->output_file_);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
  local_1e8 = (ostream *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x1b0) {
    local_1e8 = (ostream *)&stream.field_0x8;
  }
  PrintXmlUnitTest(local_1e8,unit_test);
  __stream = stream._384_8_;
  StringStreamToString(&local_1e0,(stringstream *)local_1b0);
  uVar1 = std::__cxx11::string::c_str();
  fprintf((FILE *)__stream,"%s",uVar1);
  std::__cxx11::string::~string((string *)&local_1e0);
  fclose((FILE *)stream._384_8_);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                  int /*iteration*/) {
  FILE* xmlout = OpenFileForWriting(output_file_);
  std::stringstream stream;
  PrintXmlUnitTest(&stream, unit_test);
  fprintf(xmlout, "%s", StringStreamToString(&stream).c_str());
  fclose(xmlout);
}